

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O1

void cvui::render::button(cvui_block_t *theBlock,int theState,Rect *theShape,String *theLabel)

{
  uint uVar1;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  undefined8 local_88;
  long lStack_80;
  long local_78;
  undefined8 uStack_70;
  undefined4 local_68 [2];
  cvui_block_t *local_60;
  undefined8 uStack_58;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  uStack_58 = 0;
  local_68[0] = 0x3010000;
  local_40 = theShape->x;
  local_3c = theShape->y;
  local_38 = theShape->width;
  local_34 = theShape->height;
  local_88 = 0x4044800000000000;
  lStack_80 = 0x4044800000000000;
  local_78 = 0x4044800000000000;
  uStack_70 = 0;
  local_60 = theBlock;
  cv::rectangle(local_68,&local_40,&local_88,1,8,0);
  local_50 = theShape->x + 1;
  theShape->x = local_50;
  local_4c = theShape->y + 1;
  theShape->y = local_4c;
  local_48 = theShape->width + -2;
  theShape->width = local_48;
  local_44 = theShape->height + -2;
  theShape->height = local_44;
  uStack_58 = 0;
  local_68[0] = 0x3010000;
  local_88 = 0x4052800000000000;
  lStack_80 = 0x4052800000000000;
  local_78 = 0x4052800000000000;
  uStack_70 = 0;
  local_60 = theBlock;
  cv::rectangle(local_68,&local_50,&local_88,1,8,0);
  local_98 = theShape->x + 1;
  theShape->x = local_98;
  local_94 = theShape->y + 1;
  theShape->y = local_94;
  local_90 = theShape->width + -2;
  theShape->width = local_90;
  local_8c = theShape->height + -2;
  theShape->height = local_8c;
  uStack_58 = 0;
  local_68[0] = 0x3010000;
  if (theState == 4) {
    local_88 = 0x4054800000000000;
    uVar1 = 0x40548000;
  }
  else if (theState == 5) {
    local_88 = 0x4050800000000000;
    uVar1 = 0x40508000;
  }
  else {
    local_88 = 0x4049000000000000;
    uVar1 = 0x40490000;
  }
  lStack_80 = (ulong)uVar1 << 0x20;
  local_78 = (ulong)uVar1 << 0x20;
  uStack_70 = 0;
  local_60 = theBlock;
  cv::rectangle(local_68,&local_98,&local_88,0xffffffff,8,0);
  return;
}

Assistant:

void button(cvui_block_t& theBlock, int theState, cv::Rect& theShape, const cv::String& theLabel) {
		// Outline
		cv::rectangle(theBlock.where, theShape, cv::Scalar(0x29, 0x29, 0x29));

		// Border
		theShape.x++; theShape.y++; theShape.width -= 2; theShape.height -= 2;
		cv::rectangle(theBlock.where, theShape, cv::Scalar(0x4A, 0x4A, 0x4A));

		// Inside
		theShape.x++; theShape.y++; theShape.width -= 2; theShape.height -= 2;
		cv::rectangle(theBlock.where, theShape, theState == OUT ? cv::Scalar(0x42, 0x42, 0x42) : (theState == OVER ? cv::Scalar(0x52, 0x52, 0x52) : cv::Scalar(0x32, 0x32, 0x32)), CVUI_FILLED);
	}